

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

QFixed __thiscall
QTextDocumentLayoutPrivate::findY
          (QTextDocumentLayoutPrivate *this,QFixed yFrom,QTextLayoutStruct *layoutStruct,
          QFixed requiredWidth)

{
  bool bVar1;
  QFixed lhs;
  QFixed *pQVar2;
  QTextFrameData *pQVar3;
  qsizetype qVar4;
  QTextFrameData *pQVar5;
  QFixed *in_RDX;
  int in_ESI;
  QTextLayoutStruct *in_RDI;
  long in_FS_OFFSET;
  QTextFrameData *fd;
  int i;
  QTextFrameData *lfd;
  QFixed newY;
  QFixed left;
  QFixed right;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  QFixed other;
  QList<QPointer<QTextFrame>_> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_7c;
  undefined4 in_stack_ffffffffffffff90;
  QFixed in_stack_ffffffffffffff94;
  QTextLayoutStruct *layoutStruct_00;
  undefined4 in_stack_ffffffffffffffa8;
  QFixed in_stack_ffffffffffffffac;
  QFixed in_stack_ffffffffffffffcc;
  QFixed QVar6;
  QFixed local_1c;
  QFixed local_18;
  QFixed local_14;
  QFixed local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.val = -0x55555556;
  layoutStruct_00 = in_RDI;
  local_10.val = in_ESI;
  QFixed::QFixed(&local_18);
  local_1c.val = -0x55555556;
  QFixed::QFixed(&local_1c);
  QFixed::operator-((QFixed *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                    (QFixed)(int)in_stack_ffffffffffffff60);
  pQVar2 = qMin<QFixed>((QFixed *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (QFixed *)in_RDI);
  local_14.val = pQVar2->val;
  QVar6.val = local_10.val;
  do {
    local_10.val = QVar6.val;
    floatMargins((QTextDocumentLayoutPrivate *)
                 CONCAT44(in_stack_ffffffffffffffac.val,in_stack_ffffffffffffffa8),
                 in_stack_ffffffffffffffcc,layoutStruct_00,in_RDX,
                 (QFixed *)CONCAT44(in_stack_ffffffffffffff94.val,in_stack_ffffffffffffff90));
    in_stack_ffffffffffffff94 =
         QFixed::operator-((QFixed *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           (int)in_stack_ffffffffffffff60);
    bVar1 = operator>=(in_stack_ffffffffffffff94,local_14);
    if (bVar1) break;
    QVar6.val = -0x55555556;
    QFixed::QFixed((QFixed *)&stack0xffffffffffffffcc,0x7fffff);
    pQVar3 = ::data((QTextFrame *)in_stack_ffffffffffffff60);
    local_7c = 0;
    while( true ) {
      in_stack_ffffffffffffff60 = (QList<QPointer<QTextFrame>_> *)(long)local_7c;
      qVar4 = QList<QPointer<QTextFrame>_>::size(&pQVar3->floats);
      if (qVar4 <= (long)in_stack_ffffffffffffff60) break;
      QList<QPointer<QTextFrame>_>::at
                (in_stack_ffffffffffffff60,
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      ::QPointer::operator_cast_to_QTextFrame_((QPointer<QTextFrame> *)0x80a5b9);
      pQVar5 = ::data((QTextFrame *)in_stack_ffffffffffffff60);
      other.val = (int)in_stack_ffffffffffffff60;
      if (((pQVar5->layoutDirty & 1U) == 0) &&
         (bVar1 = operator<=((QFixed)(pQVar5->position).y.val,local_10), bVar1)) {
        lhs = QFixed::operator+((QFixed *)
                                CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),other)
        ;
        bVar1 = operator>(lhs,local_10);
        if (bVar1) {
          QFixed::operator+((QFixed *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            other);
          pQVar2 = qMin<QFixed>((QFixed *)CONCAT44(lhs.val,in_stack_ffffffffffffff70),
                                (QFixed *)in_RDI);
          QVar6.val = pQVar2->val;
        }
      }
      local_7c = local_7c + 1;
    }
    in_stack_ffffffffffffffcc.val = QVar6.val;
    QFixed::QFixed((QFixed *)&stack0xffffffffffffffac,0x7fffff);
    bVar1 = ::operator==(QVar6,in_stack_ffffffffffffffac);
    QVar6.val = in_stack_ffffffffffffffcc.val;
  } while (!bVar1);
  local_c = local_10.val;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFixed)local_10.val;
}

Assistant:

QFixed QTextDocumentLayoutPrivate::findY(QFixed yFrom, const QTextLayoutStruct *layoutStruct, QFixed requiredWidth) const
{
    QFixed right, left;
    requiredWidth = qMin(requiredWidth, layoutStruct->x_right - layoutStruct->x_left);

//     qDebug() << "findY:" << yFrom;
    while (1) {
        floatMargins(yFrom, layoutStruct, &left, &right);
//         qDebug() << "    yFrom=" << yFrom<<"right=" << right << "left=" << left << "requiredWidth=" << requiredWidth;
        if (right-left >= requiredWidth)
            break;

        // move float down until we find enough space
        QFixed newY = QFIXED_MAX;
        QTextFrameData *lfd = data(layoutStruct->frame);
        for (int i = 0; i < lfd->floats.size(); ++i) {
            QTextFrameData *fd = data(lfd->floats.at(i));
            if (!fd->layoutDirty) {
                if (fd->position.y <= yFrom && fd->position.y + fd->size.height > yFrom)
                    newY = qMin(newY, fd->position.y + fd->size.height);
            }
        }
        if (newY == QFIXED_MAX)
            break;
        yFrom = newY;
    }
    return yFrom;
}